

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_chunk_split(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  int nSepLen;
  int nLen;
  uint local_44;
  long local_40;
  uint local_34;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    local_44 = 2;
    pcVar2 = jx9_value_to_string(*apArg,(int *)&local_34);
    uVar5 = 0x4c;
    pcVar7 = "\r\n";
    uVar6 = 2;
    lVar4 = (long)(int)local_34;
    pcVar3 = pcVar7;
    if (nArg != 1) {
      pObj = apArg[1];
      local_40 = (long)(int)local_34;
      jx9MemObjToInteger(pObj);
      uVar1 = *(uint *)&pObj->x;
      uVar5 = 0x4c;
      if (0 < (int)uVar1) {
        uVar5 = uVar1;
      }
      if ((uint)nArg < 3) {
        uVar6 = 2;
        lVar4 = local_40;
      }
      else {
        pcVar3 = jx9_value_to_string(apArg[2],(int *)&local_44);
        uVar6 = (ulong)local_44;
        lVar4 = local_40;
        if ((int)local_44 < 1) {
          local_44 = 2;
          uVar6 = 2;
          pcVar3 = pcVar7;
        }
      }
    }
    if ((int)local_34 < (int)uVar5) {
      jx9_result_string_format(pCtx,"%.*s%.*s",(ulong)local_34,pcVar2,uVar6,pcVar3);
    }
    else if (0 < (int)lVar4) {
      pcVar7 = pcVar2 + lVar4;
      do {
        uVar1 = (int)pcVar7 - (int)pcVar2;
        if ((int)uVar1 <= (int)uVar5) {
          uVar5 = uVar1;
        }
        jx9_result_string_format(pCtx,"%.*s%.*s",(ulong)uVar5,pcVar2,(ulong)local_44,pcVar3);
        pcVar2 = pcVar2 + (int)uVar5;
      } while (pcVar2 < pcVar7);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_chunk_split(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zSep = "\r\n";
	int nSepLen, nChunkLen, nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Nothing to split, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* initialize/Extract arguments */
	nSepLen = (int)sizeof("\r\n") - 1;
	nChunkLen = 76;
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nArg > 1 ){
		/* Chunk length */
		nChunkLen = jx9_value_to_int(apArg[1]);
		if( nChunkLen < 1 ){
			/* Switch back to the default length */
			nChunkLen = 76;
		}
		if( nArg > 2 ){
			/* Separator */
			zSep = jx9_value_to_string(apArg[2], &nSepLen);
			if( nSepLen < 1 ){
				/* Switch back to the default separator */
				zSep = "\r\n";
				nSepLen = (int)sizeof("\r\n") - 1;
			}
		}
	}
	/* Perform the requested operation */
	if( nChunkLen > nLen ){
		/* Nothing to split, return the string and the separator */
		jx9_result_string_format(pCtx, "%.*s%.*s", nLen, zIn, nSepLen, zSep);
		return JX9_OK;
	}
	while( zIn < zEnd ){
		if( nChunkLen > (int)(zEnd-zIn) ){
			nChunkLen = (int)(zEnd - zIn);
		}
		/* Append the chunk and the separator */
		jx9_result_string_format(pCtx, "%.*s%.*s", nChunkLen, zIn, nSepLen, zSep);
		/* Point beyond the chunk */
		zIn += nChunkLen;
	}
	return JX9_OK;
}